

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_path_builder_delegate_unittest.cc
# Opt level: O3

string * __thiscall
bssl::(anonymous_namespace)::
gtest_AllSimplePathBuilderDelegate2048FailTest_EvalGenerateName__abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          TestParamInfo<const_char_*> *info)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> info_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  ParamGenerator<const_char_*> PVar2;
  testing atStack_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  bVar1 = testing::internal::AlwaysTrue();
  info_00._M_pi = extraout_RDX;
  if (bVar1) goto LAB_003a9b1f;
  PVar2 = testing::ValuesIn<char_const*const*>
                    (atStack_28,(char **)kFail2048Filenames,(char **)kValueTypes);
  info_00._M_pi =
       PVar2.impl_.
       super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_char_*>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_20 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_003a9b1f;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_20->_M_use_count = local_20->_M_use_count + 1;
    UNLOCK();
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_003a9b12;
  }
  else {
    local_20->_M_use_count = local_20->_M_use_count + 1;
LAB_003a9b12:
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  info_00._M_pi = extraout_RDX_00;
LAB_003a9b1f:
  testing::internal::DefaultParamName<char_const*>
            (__return_storage_ptr__,(internal *)this,(TestParamInfo<const_char_*> *)info_00._M_pi);
  return __return_storage_ptr__;
}

Assistant:

TEST_P(SimplePathBuilderDelegate2048FailTest, RsaKeySmallerThan2048) {
  SignatureAlgorithm signature_algorithm{};
  bssl::UniquePtr<EVP_PKEY> public_key;
  ASSERT_NO_FATAL_FAILURE(
      ReadTestCase(GetParam(), &signature_algorithm, &public_key));
  ASSERT_TRUE(public_key);

  CertErrors errors;
  SimplePathBuilderDelegate delegate(
      2048, SimplePathBuilderDelegate::DigestPolicy::kWeakAllowSha1);

  EXPECT_TRUE(
      delegate.IsSignatureAlgorithmAcceptable(signature_algorithm, &errors));

  EXPECT_FALSE(delegate.IsPublicKeyAcceptable(public_key.get(), &errors));
}